

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O2

void __thiscall CompilerStatistics::CompilerStatistics(CompilerStatistics *this)

{
  SmallArray<CompilerStatistics::Timer,_16U> *this_00;
  Timer TStack_38;
  
  this_00 = &this->timers;
  SmallArray<CompilerStatistics::Timer,_16U>::SmallArray(this_00,(Allocator *)0x0);
  this->startTime = 0;
  this->finishTime = 0;
  Timer::Timer(&TStack_38,"Lexer","lexer");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Parse","parse");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Import","import");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Expressions","analyze");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Finalization","(finalize)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Cleanup","(cleanup)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"IrCodeGen","codegen");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"LlvmCodeGen","llvm");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"IrOptimization","optimization");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"IrFinalization","(finalize)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"IrLowering","lower");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Bytecode","bytecode");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"BytecodeCache","(cache)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Logging","logs");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Tracing","trace");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  Timer::Timer(&TStack_38,"Extra","extra");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(this_00,&TStack_38);
  return;
}

Assistant:

CompilerStatistics()
	{
		startTime = 0;
		finishTime = 0;

		timers.push_back(Timer("Lexer", "lexer"));
		timers.push_back(Timer("Parse", "parse"));

		timers.push_back(Timer("Import", "import"));
		timers.push_back(Timer("Expressions", "analyze"));
		timers.push_back(Timer("Finalization", "(finalize)"));
		timers.push_back(Timer("Cleanup", "(cleanup)"));

		timers.push_back(Timer("IrCodeGen", "codegen"));
		timers.push_back(Timer("LlvmCodeGen", "llvm"));
		timers.push_back(Timer("IrOptimization", "optimization"));
		timers.push_back(Timer("IrFinalization", "(finalize)"));
		timers.push_back(Timer("IrLowering", "lower"));
		timers.push_back(Timer("Bytecode", "bytecode"));
		timers.push_back(Timer("BytecodeCache", "(cache)"));

		timers.push_back(Timer("Logging", "logs"));
		timers.push_back(Timer("Tracing", "trace"));
		timers.push_back(Timer("Extra", "extra"));
	}